

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_HistoryRecord::GetColorValue(ON_HistoryRecord *this,int value_id,ON_Color *color)

{
  int iVar1;
  ON_Value *pOVar2;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar3;
  ON_ColorValue *v;
  bool rc;
  ON_Color *color_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  v._7_1_ = false;
  pOVar2 = FindValueHelper(this,value_id,4,false);
  if (pOVar2 != (ON_Value *)0x0) {
    iVar1 = ON_SimpleArray<ON_Color>::Count((ON_SimpleArray<ON_Color> *)(pOVar2 + 1));
    if (iVar1 == 1) {
      paVar3 = &ON_SimpleArray<ON_Color>::operator[]((ON_SimpleArray<ON_Color> *)(pOVar2 + 1),0)->
                field_0;
      color->field_0 = *paVar3;
      v._7_1_ = true;
    }
  }
  return v._7_1_;
}

Assistant:

bool ON_HistoryRecord::GetColorValue( int value_id, ON_Color* color ) const
{
  bool rc = false;
  const ON_ColorValue* v = static_cast<ON_ColorValue*>(FindValueHelper(value_id,ON_Value::color_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    *color = v->m_value[0];
    rc = true;
  }
  return rc;
}